

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

void __thiscall LowererMD::GenerateFastInlineBuiltInMathPow(LowererMD *this,Instr *instr)

{
  LowererMDArch *this_00;
  IRType IVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Opnd *pOVar5;
  StackSym *pSVar6;
  SymOpnd *src;
  RegOpnd *dst;
  JnHelperMethod helperMethod;
  Func *pFVar7;
  
  if ((byte)(instr->m_src2->m_type - TyFloat32) < 2) {
    if (1 < (byte)(instr->m_src1->m_type - TyFloat32)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x21b0,"(instr->GetSrc1()->IsFloat())",
                         "Math.Pow(int, double) should not generated by GlobOpt!");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    pOVar5 = IR::Instr::UnlinkSrc2(instr);
    LowererMDArch::LoadDoubleHelperArgument(&this->lowererMDArch,instr,pOVar5);
    pOVar5 = IR::Instr::UnlinkSrc1(instr);
    LowererMDArch::LoadDoubleHelperArgument(&this->lowererMDArch,instr,pOVar5);
    helperMethod = HelperDirectMath_Pow;
  }
  else {
    pOVar5 = IR::Instr::UnlinkSrc2(instr);
    this_00 = &this->lowererMDArch;
    LowererMDArch::LoadHelperArgument(this_00,instr,pOVar5);
    IVar1 = instr->m_src1->m_type;
    pOVar5 = IR::Instr::UnlinkSrc1(instr);
    if (1 < (byte)(IVar1 - TyFloat32)) {
      LowererMDArch::LoadHelperArgument(this_00,instr,pOVar5);
      pFVar7 = this->m_func;
      pSVar6 = pFVar7->tempSymBool;
      if (pSVar6 == (StackSym *)0x0) {
        pSVar6 = StackSym::New(TyUint8,pFVar7);
        pFVar7 = this->m_func;
        pFVar7->tempSymBool = pSVar6;
        Func::StackAllocate(pFVar7,pSVar6,1);
        pFVar7 = this->m_func;
        pSVar6 = pFVar7->tempSymBool;
      }
      src = IR::SymOpnd::New(&pSVar6->super_Sym,TyUint8,pFVar7);
      dst = IR::RegOpnd::New(TyInt64,this->m_func);
      Lowerer::InsertLea(dst,&src->super_Opnd,instr);
      LowererMDArch::LoadHelperArgument(this_00,instr,&dst->super_Opnd);
      helperMethod = HelperDirectMath_PowIntInt;
      goto LAB_005e2a92;
    }
    LowererMDArch::LoadDoubleHelperArgument(this_00,instr,pOVar5);
    helperMethod = HelperDirectMath_PowDoubleInt;
  }
  src = (SymOpnd *)0x0;
LAB_005e2a92:
  ChangeToHelperCall(this,instr,helperMethod,(LabelInstr *)0x0,&src->super_Opnd,
                     (PropertySymOpnd *)0x0,false);
  return;
}

Assistant:

void LowererMD::GenerateFastInlineBuiltInMathPow(IR::Instr* instr)
{
#ifdef _M_IX86
    AssertMsg(!instr->GetSrc2()->IsFloat(), "Math.pow(*, double) needs customized lowering!");
#endif

    IR::JnHelperMethod directPowHelper = (IR::JnHelperMethod)0;
    IR::Opnd* bailoutOpnd = nullptr;

    if (!instr->GetSrc2()->IsFloat())
    {
        LoadHelperArgument(instr, instr->UnlinkSrc2());

        if (instr->GetSrc1()->IsFloat())
        {
            directPowHelper = IR::HelperDirectMath_PowDoubleInt;
            LoadDoubleHelperArgument(instr, instr->UnlinkSrc1());
        }
        else
        {
            directPowHelper = IR::HelperDirectMath_PowIntInt;
            LoadHelperArgument(instr, instr->UnlinkSrc1());

            if (!this->m_func->tempSymBool)
            {
                this->m_func->tempSymBool = StackSym::New(TyUint8, this->m_func);
                this->m_func->StackAllocate(this->m_func->tempSymBool, TySize[TyUint8]);
            }
            IR::SymOpnd* boolOpnd = IR::SymOpnd::New(this->m_func->tempSymBool, TyUint8, this->m_func);
            IR::RegOpnd* boolRefOpnd = IR::RegOpnd::New(TyMachReg, this->m_func);
            this->m_lowerer->InsertLea(boolRefOpnd, boolOpnd, instr);
            LoadHelperArgument(instr, boolRefOpnd);

            bailoutOpnd = boolOpnd;
        }
    }
#ifndef _M_IX86
    else
    {
        AssertMsg(instr->GetSrc1()->IsFloat(), "Math.Pow(int, double) should not generated by GlobOpt!");
        directPowHelper = IR::HelperDirectMath_Pow;
        LoadDoubleHelperArgument(instr, instr->UnlinkSrc2());
        LoadDoubleHelperArgument(instr, instr->UnlinkSrc1());
    }
#endif

    ChangeToHelperCall(instr, directPowHelper, nullptr, bailoutOpnd);
}